

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void collect_scan_var(gen_ctx_t gen_ctx,MIR_reg_t var)

{
  VARR_int *varr;
  int iVar1;
  size_t sVar2;
  MIR_reg_t var_local;
  gen_ctx_t gen_ctx_local;
  
  iVar1 = bitmap_set_bit_p(gen_ctx->temp_bitmap,(ulong)var);
  if ((iVar1 != 0) && (gen_ctx->lr_ctx->scan_vars_num < 10000)) {
    while (sVar2 = VARR_intlength(gen_ctx->lr_ctx->var_to_scan_var_map), sVar2 <= var) {
      VARR_intpush(gen_ctx->lr_ctx->var_to_scan_var_map,-1);
    }
    VARR_MIR_reg_tpush(gen_ctx->lr_ctx->scan_var_to_var_map,var);
    varr = gen_ctx->lr_ctx->var_to_scan_var_map;
    iVar1 = gen_ctx->lr_ctx->scan_vars_num;
    gen_ctx->lr_ctx->scan_vars_num = iVar1 + 1;
    VARR_intset(varr,(ulong)var,iVar1);
  }
  return;
}

Assistant:

static void collect_scan_var (gen_ctx_t gen_ctx, MIR_reg_t var) {
  if (!bitmap_set_bit_p (temp_bitmap, var)) return;
  if (scan_vars_num >= MIR_MAX_COALESCE_VARS) return;
  while (VARR_LENGTH (int, var_to_scan_var_map) <= var) VARR_PUSH (int, var_to_scan_var_map, -1);
  VARR_PUSH (MIR_reg_t, scan_var_to_var_map, var);
  VARR_SET (int, var_to_scan_var_map, var, scan_vars_num++);
}